

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateHeader
          (EnumGenerator *this,Printer *printer)

{
  string *value;
  bool bVar1;
  pointer ppEVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int i;
  EnumValueDescriptor *extraout_RDX;
  EnumValueDescriptor *extraout_RDX_00;
  EnumValueDescriptor *extraout_RDX_01;
  EnumValueDescriptor *extraout_RDX_02;
  EnumValueDescriptor *extraout_RDX_03;
  EnumValueDescriptor *descriptor;
  ulong uVar4;
  string local_188;
  string comments;
  string enum_comments;
  SourceLocation location_1;
  string local_b8;
  SourceLocation location;
  
  enum_comments._M_dataplus._M_p = (pointer)&enum_comments.field_2;
  enum_comments._M_string_length = 0;
  enum_comments.field_2._M_local_buf[0] = '\0';
  location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
  location.leading_comments._M_string_length = 0;
  location.leading_comments.field_2._M_local_buf[0] = '\0';
  paVar3 = &location.trailing_comments.field_2;
  location.trailing_comments._M_string_length = 0;
  location.trailing_comments.field_2._M_local_buf[0] = '\0';
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  location.trailing_comments._M_dataplus._M_p = (pointer)paVar3;
  bVar1 = EnumDescriptor::GetSourceLocation(this->descriptor_,&location);
  if (bVar1) {
    BuildCommentsString_abi_cxx11_
              ((string *)&location_1,(objectivec *)&location,(SourceLocation *)0x1,SUB81(paVar3,0));
    std::__cxx11::string::operator=((string *)&enum_comments,(string *)&location_1);
    if ((string *)location_1._0_8_ != &location_1.leading_comments) {
      operator_delete((void *)location_1._0_8_,
                      (ulong)(location_1.leading_comments._M_dataplus._M_p + 1));
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&enum_comments,0,(char *)enum_comments._M_string_length,0x352e62);
  }
  value = &this->name_;
  io::Printer::Print(printer,"#pragma mark - Enum $name$\n\n","name",value);
  GetOptionalDeprecatedAttribute<google::protobuf::EnumDescriptor>
            ((string *)&location_1,this->descriptor_,*(FileDescriptor **)(this->descriptor_ + 0x10),
             true,false);
  io::Printer::Print(printer,"$comments$typedef$deprecated_attribute$ GPB_ENUM($name$) {\n",
                     "comments",&enum_comments,"deprecated_attribute",(string *)&location_1,"name",
                     value);
  if ((string *)location_1._0_8_ != &location_1.leading_comments) {
    operator_delete((void *)location_1._0_8_,
                    (ulong)(location_1.leading_comments._M_dataplus._M_p + 1));
  }
  io::Printer::Indent(printer);
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
    io::Printer::Print(printer,
                       "/**\n * Value used if any message\'s field encounters a value that is not defined\n * by this enum. The message will also have C functions to get/set the rawValue\n * of the field.\n **/\n$name$_GPBUnrecognizedEnumeratorValue = kGPBUnrecognizedEnumeratorValue,\n"
                       ,"name",value);
  }
  ppEVar2 = (this->all_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->all_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar2) {
    uVar4 = 0;
    do {
      location_1.leading_comments._M_dataplus._M_p = (pointer)&location_1.leading_comments.field_2;
      location_1.leading_comments._M_string_length = 0;
      location_1.leading_comments.field_2._M_local_buf[0] = '\0';
      paVar3 = &location_1.trailing_comments.field_2;
      location_1.trailing_comments._M_string_length = 0;
      location_1.trailing_comments.field_2._M_local_buf[0] = '\0';
      location_1.leading_detached_comments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      location_1.leading_detached_comments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      location_1.leading_detached_comments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      location_1.trailing_comments._M_dataplus._M_p = (pointer)paVar3;
      bVar1 = EnumValueDescriptor::GetSourceLocation(ppEVar2[uVar4],&location_1);
      descriptor = extraout_RDX;
      if (bVar1) {
        BuildCommentsString_abi_cxx11_
                  (&local_188,(objectivec *)&location_1,(SourceLocation *)0x1,SUB81(paVar3,0));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&comments,local_188._M_dataplus._M_p,(allocator<char> *)&local_b8);
        descriptor = extraout_RDX_00;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          descriptor = extraout_RDX_01;
        }
        if (comments._M_string_length != 0) {
          if (uVar4 != 0) {
            io::Printer::Print(printer,"\n");
          }
          io::Printer::Print(printer,comments._M_dataplus._M_p);
          descriptor = extraout_RDX_02;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)comments._M_dataplus._M_p != &comments.field_2) {
          operator_delete(comments._M_dataplus._M_p,comments.field_2._M_allocated_capacity + 1);
          descriptor = extraout_RDX_03;
        }
      }
      EnumValueName_abi_cxx11_
                (&comments,
                 (objectivec *)
                 (this->all_values_).
                 super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4],descriptor);
      GetOptionalDeprecatedAttribute<google::protobuf::EnumValueDescriptor>
                (&local_188,
                 (this->all_values_).
                 super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4],(FileDescriptor *)0x0,true,false);
      SimpleItoa_abi_cxx11_
                (&local_b8,
                 (protobuf *)
                 (ulong)*(uint *)((this->all_values_).
                                  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar4] + 0x10),i);
      io::Printer::Print(printer,"$name$$deprecated_attribute$ = $value$,\n","name",&comments,
                         "deprecated_attribute",&local_188,"value",&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)comments._M_dataplus._M_p != &comments.field_2) {
        operator_delete(comments._M_dataplus._M_p,comments.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&location_1.leading_detached_comments);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)location_1.trailing_comments._M_dataplus._M_p != &location_1.trailing_comments.field_2)
      {
        operator_delete(location_1.trailing_comments._M_dataplus._M_p,
                        CONCAT71(location_1.trailing_comments.field_2._M_allocated_capacity._1_7_,
                                 location_1.trailing_comments.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)location_1.leading_comments._M_dataplus._M_p != &location_1.leading_comments.field_2) {
        operator_delete(location_1.leading_comments._M_dataplus._M_p,
                        CONCAT71(location_1.leading_comments.field_2._M_allocated_capacity._1_7_,
                                 location_1.leading_comments.field_2._M_local_buf[0]) + 1);
      }
      uVar4 = uVar4 + 1;
      ppEVar2 = (this->all_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->all_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3))
    ;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "};\n\nGPBEnumDescriptor *$name$_EnumDescriptor(void);\n\n/**\n * Checks to see if the given value is defined by the enum or was not known at\n * the time this source was generated.\n **/\nBOOL $name$_IsValidValue(int32_t value);\n\n"
                     ,"name",value);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&location.leading_detached_comments);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)location.trailing_comments._M_dataplus._M_p != &location.trailing_comments.field_2) {
    operator_delete(location.trailing_comments._M_dataplus._M_p,
                    CONCAT71(location.trailing_comments.field_2._M_allocated_capacity._1_7_,
                             location.trailing_comments.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)location.leading_comments._M_dataplus._M_p != &location.leading_comments.field_2) {
    operator_delete(location.leading_comments._M_dataplus._M_p,
                    CONCAT71(location.leading_comments.field_2._M_allocated_capacity._1_7_,
                             location.leading_comments.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)enum_comments._M_dataplus._M_p != &enum_comments.field_2) {
    operator_delete(enum_comments._M_dataplus._M_p,
                    CONCAT71(enum_comments.field_2._M_allocated_capacity._1_7_,
                             enum_comments.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void EnumGenerator::GenerateHeader(io::Printer* printer) {
  string enum_comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    enum_comments = BuildCommentsString(location, true);
  } else {
    enum_comments = "";
  }

  printer->Print(
      "#pragma mark - Enum $name$\n"
      "\n",
      "name", name_);

  printer->Print("$comments$typedef$deprecated_attribute$ GPB_ENUM($name$) {\n",
                 "comments", enum_comments,
                 "deprecated_attribute", GetOptionalDeprecatedAttribute(descriptor_, descriptor_->file()),
                 "name", name_);
  printer->Indent();

  if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
    // Include the unknown value.
    printer->Print(
      "/**\n"
      " * Value used if any message's field encounters a value that is not defined\n"
      " * by this enum. The message will also have C functions to get/set the rawValue\n"
      " * of the field.\n"
      " **/\n"
      "$name$_GPBUnrecognizedEnumeratorValue = kGPBUnrecognizedEnumeratorValue,\n",
      "name", name_);
  }
  for (int i = 0; i < all_values_.size(); i++) {
    SourceLocation location;
    if (all_values_[i]->GetSourceLocation(&location)) {
      string comments = BuildCommentsString(location, true).c_str();
      if (comments.length() > 0) {
        if (i > 0) {
          printer->Print("\n");
        }
        printer->Print(comments.c_str());
      }
    }

    printer->Print(
        "$name$$deprecated_attribute$ = $value$,\n",
        "name", EnumValueName(all_values_[i]),
        "deprecated_attribute", GetOptionalDeprecatedAttribute(all_values_[i]),
        "value", SimpleItoa(all_values_[i]->number()));
  }
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n"
      "GPBEnumDescriptor *$name$_EnumDescriptor(void);\n"
      "\n"
      "/**\n"
      " * Checks to see if the given value is defined by the enum or was not known at\n"
      " * the time this source was generated.\n"
      " **/\n"
      "BOOL $name$_IsValidValue(int32_t value);\n"
      "\n",
      "name", name_);
}